

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

NodePtr __thiscall dh::analysis::expr_stmt(analysis *this)

{
  TYPE TVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar2;
  NodePtr tmp_ptr;
  undefined1 local_48 [16];
  string local_38;
  
  local_48._0_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  std::make_shared<dh::TreeNode,char_const(&)[5],int>((char (*) [5])this,(int *)"Expr");
  local_48._0_4_ = 4;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_48);
  local_48._0_4_ = 7;
  TreeNode::setKind(*(TreeNode **)this,(int *)local_48);
  TVar1 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar1 == SEPOP) {
    local_48._0_8_ = (element_type *)0x0;
    local_48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    TreeNode::appendChild(*(TreeNode **)this,(NodePtr *)local_48);
  }
  else {
    assignment_expr((analysis *)local_48);
    TreeNode::appendChild(*(TreeNode **)this,(NodePtr *)local_48);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::string((string *)(local_48 + 0x10),";",(allocator *)local_48);
  match(in_RSI,(string *)(local_48 + 0x10));
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::expr_stmt()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in expr_stmt\n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("Expr",tmp->getLineno());

	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::ExpK);

	if ( tmp->getType() != TYPE::SEPOP)
	{
		NodePtr tmp_ptr = expr();
		ret->appendChild(tmp_ptr);
	} else 
	{
		ret->appendChild(nullptr);
	}
	match(";");

	return ret;
}